

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_char,_8,_false>_>_>
::CreateTest(TestFactoryImpl<gtest_suite_NoiseModelUpdateTest_::UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_char,_8,_false>_>_>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x3d8);
  gtest_suite_NoiseModelUpdateTest_::
  UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_char,_8,_false>_>::
  UpdateSuccessForZeroNoiseAllFlat
            ((UpdateSuccessForZeroNoiseAllFlat<BitDepthParams<unsigned_char,_8,_false>_> *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }